

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManWriteNames(FILE *pFile,char c,int n,Vec_Ptr_t *vNames,int Start,int Skip,
                      Vec_Bit_t *vObjs)

{
  bool bVar1;
  int d;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  char *pName;
  int fFirst;
  int i;
  int Length;
  int Digits;
  int Skip_local;
  int Start_local;
  Vec_Ptr_t *vNames_local;
  int n_local;
  char c_local;
  FILE *pFile_local;
  
  d = Abc_Base10Log(n);
  bVar1 = true;
  fFirst = Start;
  for (pName._4_4_ = 0; pName._4_4_ < n; pName._4_4_ = pName._4_4_ + 1) {
    if ((vObjs == (Vec_Bit_t *)0x0) || (iVar2 = Vec_BitEntry(vObjs,pName._4_4_), iVar2 != 0)) {
      __s = Gia_ObjGetDumpName(vNames,c,pName._4_4_,d);
      sVar3 = strlen(__s);
      fFirst = fFirst + (int)sVar3 + 2;
      if (0x3c < fFirst) {
        fprintf((FILE *)pFile,",\n    ");
        bVar1 = true;
        fFirst = Skip;
      }
      pcVar4 = ", ";
      if (bVar1) {
        pcVar4 = "";
      }
      fprintf((FILE *)pFile,"%s%s",pcVar4,__s);
      bVar1 = false;
    }
  }
  return;
}

Assistant:

void Gia_ManWriteNames( FILE * pFile, char c, int n, Vec_Ptr_t * vNames, int Start, int Skip, Vec_Bit_t * vObjs )
{
    int Digits = Abc_Base10Log( n );
    int Length = Start, i, fFirst = 1; 
    char * pName;
    for ( i = 0; i < n; i++ )
    {
        if ( vObjs && !Vec_BitEntry(vObjs, i) )
            continue;
        pName = Gia_ObjGetDumpName( vNames, c, i, Digits );
        Length += strlen(pName) + 2;
        if ( Length > 60 )
        {
            fprintf( pFile, ",\n    " );
            Length = Skip;
            fFirst = 1;
        }
        fprintf( pFile, "%s%s", fFirst ? "":", ", pName );
        fFirst = 0;
    }
}